

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::FboRenderTestGroup::init(FboRenderTestGroup *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  bool bVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  long lVar7;
  TestNode *pTVar8;
  RecreateBuffersTest *pRVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int fmtNdx;
  long lVar13;
  bool bVar14;
  int depthStencilFmtNdx;
  long lVar15;
  FboConfig config;
  FboConfig local_b8;
  TestNode *local_90;
  TestNode *local_88;
  TestNode *local_80;
  long local_78;
  FboConfig local_70;
  FboConfig local_50;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "stencil_clear","Stencil buffer clears");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar13 = 0;
  do {
    if (init::depthStencilFormats[lVar13].stencil == true) {
      local_b8.depthStencilFormat = init::depthStencilFormats[lVar13].format;
      local_b8.buffers = 0x4400;
      local_b8.colorType = 0xde1;
      local_b8.colorFormat = 0x8058;
      local_b8.depthStencilType = 0x8d41;
      local_b8.width = 0;
      local_b8.height = 0;
      local_b8.samples = 0;
      pTVar6 = (TestNode *)operator_new(0x98);
      FboCases::StencilClearsTest::StencilClearsTest
                ((StencilClearsTest *)pTVar6,(this->super_TestCaseGroup).m_context,&local_b8);
      tcu::TestNode::addChild(pTVar5,pTVar6);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 6);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "shared_colorbuffer_clear","Shader colorbuffer clears");
  local_90 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar13 = 0;
  do {
    if ((init::colorFormats[lVar13].type & ~FORMATTYPE_FIXED) != FORMATTYPE_INT) {
      dVar2 = init::colorFormats[lVar13].format;
      lVar7 = 0;
      bVar1 = true;
      do {
        bVar14 = bVar1;
        local_b8.colorType = init::objectTypes[lVar7];
        local_b8.buffers = 0x4000;
        local_b8.depthStencilType = 0;
        local_b8.depthStencilFormat = 0;
        local_b8.width = 0;
        local_b8.height = 0;
        local_b8.samples = 0;
        local_b8.colorFormat = dVar2;
        pTVar6 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferClearsTest::SharedColorbufferClearsTest
                  ((SharedColorbufferClearsTest *)pTVar6,(Context *)local_90[1]._vptr_TestNode,
                   &local_b8);
        tcu::TestNode::addChild(pTVar5,pTVar6);
        lVar7 = 1;
        bVar1 = false;
      } while (bVar14);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x24);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar5 = local_90;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_90->m_testCtx,"shared_colorbuffer",
             "Shared colorbuffer tests");
  local_88 = pTVar6;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = local_88;
  lVar13 = 0;
  do {
    if (((((init::colorFormats[lVar13].type & ~FORMATTYPE_FIXED) != FORMATTYPE_INT) &&
         (dVar2 = init::colorFormats[lVar13].format, 1 < dVar2 - 0x8814)) && (dVar2 != 0x822e)) &&
       (dVar2 != 0x8230)) {
      lVar7 = 0;
      bVar1 = true;
      do {
        bVar14 = bVar1;
        local_b8.colorType = init::objectTypes[lVar7];
        local_b8.buffers = 0x4000;
        local_b8.samples = 0;
        local_b8.depthStencilType = 0;
        local_b8.depthStencilFormat = 0;
        local_b8.width = 0;
        local_b8.height = 0;
        local_50.buffers = 0x4100;
        local_50.depthStencilType = 0x8d41;
        local_50.depthStencilFormat = 0x88f0;
        local_50.width = 0;
        local_50.height = 0;
        local_50.samples = 0;
        local_70.buffers = 0x4500;
        local_70.depthStencilType = 0x8d41;
        local_70.depthStencilFormat = 0x88f0;
        local_70.width = 0;
        local_70.height = 0;
        local_70.samples = 0;
        local_b8.colorFormat = dVar2;
        local_70.colorType = local_b8.colorType;
        local_70.colorFormat = dVar2;
        local_50.colorType = local_b8.colorType;
        local_50.colorFormat = dVar2;
        pTVar8 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar8,(Context *)pTVar5[1]._vptr_TestNode,&local_b8);
        tcu::TestNode::addChild(pTVar6,pTVar8);
        pTVar8 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar8,(Context *)pTVar5[1]._vptr_TestNode,&local_50);
        tcu::TestNode::addChild(pTVar6,pTVar8);
        pTVar8 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar8,(Context *)pTVar5[1]._vptr_TestNode,&local_70);
        tcu::TestNode::addChild(pTVar6,pTVar8);
        lVar7 = 1;
        bVar1 = false;
      } while (bVar14);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x24);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar5->m_testCtx,"shared_depth_stencil",
             "Shared depth and stencil buffers");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar13 = 0;
  do {
    if (init::depthStencilFormats[lVar13].depth == true) {
      bVar1 = init::depthStencilFormats[lVar13].stencil;
      dVar2 = init::depthStencilFormats[lVar13].format;
      lVar7 = 0;
      bVar14 = true;
      do {
        bVar11 = bVar14;
        local_b8.depthStencilType = init::objectTypes[lVar7];
        local_b8.colorType = 0xde1;
        local_b8.colorFormat = 0x8058;
        local_b8.width = 0;
        local_b8.height = 0;
        local_b8.samples = 0;
        local_b8.buffers = (uint)bVar1 << 10 | 0x4100;
        local_b8.depthStencilFormat = dVar2;
        pTVar5 = (TestNode *)operator_new(0x98);
        FboCases::SharedDepthStencilTest::SharedDepthStencilTest
                  ((SharedDepthStencilTest *)pTVar5,(Context *)local_90[1]._vptr_TestNode,&local_b8)
        ;
        tcu::TestNode::addChild(pTVar6,pTVar5);
        lVar7 = 1;
        bVar14 = false;
      } while (bVar11);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 6);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar5 = local_90;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_90->m_testCtx,"resize","FBO resize tests");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar13 = 0;
  local_80 = pTVar6;
  do {
    pTVar6 = local_80;
    local_88 = (TestNode *)CONCAT44(local_88._4_4_,init::colorFormats[lVar13].format);
    lVar7 = 0;
    bVar1 = true;
    do {
      bVar14 = bVar1;
      local_b8.colorType = init::objectTypes[lVar7];
      local_b8.buffers = 0x4000;
      local_b8.colorFormat = (GLenum)local_88;
      local_b8.depthStencilType = 0;
      local_b8.depthStencilFormat = 0;
      local_b8.width = 0;
      local_b8.height = 0;
      local_b8.samples = 0;
      pTVar8 = (TestNode *)operator_new(0x98);
      FboCases::ResizeTest::ResizeTest
                ((ResizeTest *)pTVar8,(Context *)pTVar5[1]._vptr_TestNode,&local_b8);
      tcu::TestNode::addChild(pTVar6,pTVar8);
      lVar7 = 1;
      bVar1 = false;
    } while (bVar14);
    local_78 = lVar13;
    if (((GLenum)local_88 == 0x881a) || ((GLenum)local_88 == 0x8058)) {
      lVar13 = 0;
      do {
        bVar1 = init::depthStencilFormats[lVar13].depth;
        bVar14 = init::depthStencilFormats[lVar13].stencil;
        bVar10 = false;
        lVar7 = 0;
        bVar11 = true;
LAB_012a9a4d:
        do {
          bVar4 = bVar11;
          lVar15 = lVar7;
          lVar7 = 1;
          if (!bVar10) {
            bVar10 = true;
            bVar11 = false;
            if (bVar1 == false) goto LAB_012a9a4d;
          }
          local_b8.depthStencilType = init::objectTypes[lVar15];
          local_b8.depthStencilFormat = init::depthStencilFormats[lVar13].format;
          local_b8.colorType = 0xde1;
          local_b8.colorFormat = (GLenum)local_88;
          local_b8.width = 0;
          local_b8.height = 0;
          local_b8.samples = 0;
          local_b8.buffers = (uint)bVar1 * 0x100 + (uint)bVar14 * 0x400 + 0x4000;
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::ResizeTest::ResizeTest
                    ((ResizeTest *)pTVar5,(Context *)local_90[1]._vptr_TestNode,&local_b8);
          tcu::TestNode::addChild(local_80,pTVar5);
          bVar10 = true;
          bVar11 = false;
        } while (bVar4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 6);
    }
    pTVar5 = local_90;
    lVar13 = local_78 + 1;
  } while (lVar13 != 0x24);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar5->m_testCtx,"recreate_color","Recreate colorbuffer tests"
            );
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar13 = 0;
  do {
    dVar2 = init::colorFormats[lVar13].format;
    lVar7 = 0;
    bVar1 = true;
    do {
      bVar14 = bVar1;
      local_b8.colorType = init::objectTypes[lVar7];
      local_b8.buffers = 0x4500;
      local_b8.depthStencilType = 0x8d41;
      local_b8.depthStencilFormat = 0x88f0;
      local_b8.width = 0;
      local_b8.height = 0;
      local_b8.samples = 0;
      local_b8.colorFormat = dVar2;
      pRVar9 = (RecreateBuffersTest *)operator_new(0xa0);
      FboCases::RecreateBuffersTest::RecreateBuffersTest
                (pRVar9,(Context *)local_90[1]._vptr_TestNode,&local_b8,0x4000,true);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pRVar9);
      lVar7 = 1;
      bVar1 = false;
    } while (bVar14);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x24);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar5 = local_90;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_90->m_testCtx,"recreate_depth_stencil",
             "Recreate depth and stencil buffers");
  local_80 = pTVar6;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar13 = 0;
  do {
    bVar1 = init::depthStencilFormats[lVar13].depth;
    iVar3 = (uint)init::depthStencilFormats[lVar13].stencil * 0x400;
    iVar12 = (uint)bVar1 * 0x100;
    local_88 = (TestNode *)CONCAT44(local_88._4_4_,iVar12 + iVar3);
    bVar11 = false;
    lVar7 = 0;
    bVar14 = true;
LAB_012a9c4a:
    do {
      bVar10 = bVar14;
      lVar15 = lVar7;
      lVar7 = 1;
      if (!bVar11) {
        bVar11 = true;
        bVar14 = false;
        if (bVar1 == false) goto LAB_012a9c4a;
      }
      local_b8.depthStencilType = init::objectTypes[lVar15];
      local_b8.depthStencilFormat = init::depthStencilFormats[lVar13].format;
      local_b8.colorType = 0xde1;
      local_b8.colorFormat = 0x8058;
      local_b8.width = 0;
      local_b8.height = 0;
      local_b8.samples = 0;
      local_b8.buffers = iVar12 + iVar3 + 0x4000;
      pRVar9 = (RecreateBuffersTest *)operator_new(0xa0);
      FboCases::RecreateBuffersTest::RecreateBuffersTest
                (pRVar9,(Context *)local_90[1]._vptr_TestNode,&local_b8,(GLenum)local_88,true);
      tcu::TestNode::addChild(local_80,(TestNode *)pRVar9);
      bVar11 = true;
      bVar14 = false;
    } while (bVar10);
    lVar13 = lVar13 + 1;
    if (lVar13 == 6) {
      return 0;
    }
  } while( true );
}

Assistant:

void FboRenderTestGroup::init (void)
{
	static const deUint32 objectTypes[] =
	{
		GL_TEXTURE_2D,
		GL_RENDERBUFFER
	};

	enum FormatType
	{
		FORMATTYPE_FLOAT = 0,
		FORMATTYPE_FIXED,
		FORMATTYPE_INT,
		FORMATTYPE_UINT,

		FORMATTYPE_LAST
	};

	// Required by specification.
	static const struct
	{
		deUint32	format;
		FormatType	type;
	} colorFormats[] =
	{
		{ GL_RGBA32F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA32I,			FORMATTYPE_INT		},
		{ GL_RGBA32UI,			FORMATTYPE_UINT		},
		{ GL_RGBA16F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA16I,			FORMATTYPE_INT		},
		{ GL_RGBA16UI,			FORMATTYPE_UINT		},
		{ GL_RGB16F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA8,				FORMATTYPE_FIXED	},
		{ GL_RGBA8I,			FORMATTYPE_INT		},
		{ GL_RGBA8UI,			FORMATTYPE_UINT		},
		{ GL_SRGB8_ALPHA8,		FORMATTYPE_FIXED	},
		{ GL_RGB10_A2,			FORMATTYPE_FIXED	},
		{ GL_RGB10_A2UI,		FORMATTYPE_UINT		},
		{ GL_RGBA4,				FORMATTYPE_FIXED	},
		{ GL_RGB5_A1,			FORMATTYPE_FIXED	},
		{ GL_RGB8,				FORMATTYPE_FIXED	},
		{ GL_RGB565,			FORMATTYPE_FIXED	},
		{ GL_R11F_G11F_B10F,	FORMATTYPE_FLOAT	},
		{ GL_RG32F,				FORMATTYPE_FLOAT	},
		{ GL_RG32I,				FORMATTYPE_INT		},
		{ GL_RG32UI,			FORMATTYPE_UINT		},
		{ GL_RG16F,				FORMATTYPE_FLOAT	},
		{ GL_RG16I,				FORMATTYPE_INT		},
		{ GL_RG16UI,			FORMATTYPE_UINT		},
		{ GL_RG8,				FORMATTYPE_FLOAT	},
		{ GL_RG8I,				FORMATTYPE_INT		},
		{ GL_RG8UI,				FORMATTYPE_UINT		},
		{ GL_R32F,				FORMATTYPE_FLOAT	},
		{ GL_R32I,				FORMATTYPE_INT		},
		{ GL_R32UI,				FORMATTYPE_UINT		},
		{ GL_R16F,				FORMATTYPE_FLOAT	},
		{ GL_R16I,				FORMATTYPE_INT		},
		{ GL_R16UI,				FORMATTYPE_UINT		},
		{ GL_R8,				FORMATTYPE_FLOAT	},
		{ GL_R8I,				FORMATTYPE_INT		},
		{ GL_R8UI,				FORMATTYPE_UINT		}
	};

	static const struct
	{
		deUint32	format;
		bool		depth;
		bool		stencil;
	} depthStencilFormats[] =
	{
		{ GL_DEPTH_COMPONENT32F,	true,	false	},
		{ GL_DEPTH_COMPONENT24,		true,	false	},
		{ GL_DEPTH_COMPONENT16,		true,	false	},
		{ GL_DEPTH32F_STENCIL8,		true,	true	},
		{ GL_DEPTH24_STENCIL8,		true,	true	},
		{ GL_STENCIL_INDEX8,		false,	true	}
	};

	using namespace FboCases;

	// .stencil_clear
	tcu::TestCaseGroup* stencilClearGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_clear", "Stencil buffer clears");
	addChild(stencilClearGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType	= GL_TEXTURE_2D;
		deUint32	stencilType	= GL_RENDERBUFFER;
		deUint32	colorFmt	= GL_RGBA8;

		if (!depthStencilFormats[fmtNdx].stencil)
			continue;

		FboConfig config(GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT, colorType, colorFmt, stencilType, depthStencilFormats[fmtNdx].format);
		stencilClearGroup->addChild(new StencilClearsTest(m_context, config));
	}

	// .shared_colorbuffer_clear
	tcu::TestCaseGroup* sharedColorbufferClearGroup = new tcu::TestCaseGroup(m_testCtx, "shared_colorbuffer_clear", "Shader colorbuffer clears");
	addChild(sharedColorbufferClearGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		// Clearing of integer buffers is undefined.
		if (colorFormats[colorFmtNdx].type == FORMATTYPE_INT || colorFormats[colorFmtNdx].type == FORMATTYPE_UINT)
			continue;

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT, objectTypes[typeNdx], colorFormats[colorFmtNdx].format, GL_NONE, GL_NONE);
			sharedColorbufferClearGroup->addChild(new SharedColorbufferClearsTest(m_context, config));
		}
	}

	// .shared_colorbuffer
	tcu::TestCaseGroup* sharedColorbufferGroup = new tcu::TestCaseGroup(m_testCtx, "shared_colorbuffer", "Shared colorbuffer tests");
	addChild(sharedColorbufferGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32	depthStencilType	= GL_RENDERBUFFER;
		deUint32	depthStencilFormat	= GL_DEPTH24_STENCIL8;

		// Blending with integer buffers and fp32 targets is not supported.
		if (colorFormats[colorFmtNdx].type == FORMATTYPE_INT	||
			colorFormats[colorFmtNdx].type == FORMATTYPE_UINT	||
			colorFormats[colorFmtNdx].format == GL_RGBA32F		||
			colorFormats[colorFmtNdx].format == GL_RGB32F		||
			colorFormats[colorFmtNdx].format == GL_RG32F		||
			colorFormats[colorFmtNdx].format == GL_R32F)
			continue;

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig colorOnlyConfig			(GL_COLOR_BUFFER_BIT,											objectTypes[typeNdx], colorFormats[colorFmtNdx].format, GL_NONE, GL_NONE);
			FboConfig colorDepthConfig			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT,						objectTypes[typeNdx], colorFormats[colorFmtNdx].format, depthStencilType, depthStencilFormat);
			FboConfig colorDepthStencilConfig	(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT,	objectTypes[typeNdx], colorFormats[colorFmtNdx].format, depthStencilType, depthStencilFormat);

			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorOnlyConfig));
			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorDepthConfig));
			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorDepthStencilConfig));
		}
	}

	// .shared_depth_stencil
	tcu::TestCaseGroup* sharedDepthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "shared_depth_stencil", "Shared depth and stencil buffers");
	addChild(sharedDepthStencilGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType		= GL_TEXTURE_2D;
		deUint32	colorFmt		= GL_RGBA8;
		bool		depth			= depthStencilFormats[fmtNdx].depth;
		bool		stencil			= depthStencilFormats[fmtNdx].stencil;

		if (!depth)
			continue; // Not verified.

		// Depth and stencil: both rbo and textures
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), colorType, colorFmt, objectTypes[typeNdx], depthStencilFormats[fmtNdx].format);
			sharedDepthStencilGroup->addChild(new SharedDepthStencilTest(m_context, config));
		}
	}

	// .resize
	tcu::TestCaseGroup* resizeGroup = new tcu::TestCaseGroup(m_testCtx, "resize", "FBO resize tests");
	addChild(resizeGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32 colorFormat = colorFormats[colorFmtNdx].format;

		// Color-only.
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT, objectTypes[typeNdx], colorFormat, GL_NONE, GL_NONE);
			resizeGroup->addChild(new ResizeTest(m_context, config));
		}

		// For selected color formats tests depth & stencil variants.
		if (colorFormat == GL_RGBA8 || colorFormat == GL_RGBA16F)
		{
			for (int depthStencilFmtNdx = 0; depthStencilFmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); depthStencilFmtNdx++)
			{
				deUint32	colorType		= GL_TEXTURE_2D;
				bool		depth			= depthStencilFormats[depthStencilFmtNdx].depth;
				bool		stencil			= depthStencilFormats[depthStencilFmtNdx].stencil;

				// Depth and stencil: both rbo and textures
				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
				{
					if (!depth && objectTypes[typeNdx] != GL_RENDERBUFFER)
						continue; // Not supported.

					FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0),
									 colorType, colorFormat,
									 objectTypes[typeNdx], depthStencilFormats[depthStencilFmtNdx].format);
					resizeGroup->addChild(new ResizeTest(m_context, config));
				}
			}
		}
	}

	// .recreate_color
	tcu::TestCaseGroup* recreateColorGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_color", "Recreate colorbuffer tests");
	addChild(recreateColorGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32	colorFormat			= colorFormats[colorFmtNdx].format;
		deUint32	depthStencilFormat	= GL_DEPTH24_STENCIL8;
		deUint32	depthStencilType	= GL_RENDERBUFFER;

		// Color-only.
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT, objectTypes[typeNdx], colorFormat, depthStencilType, depthStencilFormat);
			recreateColorGroup->addChild(new RecreateBuffersTest(m_context, config, GL_COLOR_BUFFER_BIT, true /* rebind */));
		}
	}

	// .recreate_depth_stencil
	tcu::TestCaseGroup* recreateDepthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_depth_stencil", "Recreate depth and stencil buffers");
	addChild(recreateDepthStencilGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType		= GL_TEXTURE_2D;
		deUint32	colorFmt		= GL_RGBA8;
		bool		depth			= depthStencilFormats[fmtNdx].depth;
		bool		stencil			= depthStencilFormats[fmtNdx].stencil;

		// Depth and stencil: both rbo and textures
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			if (!depth && objectTypes[typeNdx] != GL_RENDERBUFFER)
				continue;

			FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), colorType, colorFmt, objectTypes[typeNdx], depthStencilFormats[fmtNdx].format);
			recreateDepthStencilGroup->addChild(new RecreateBuffersTest(m_context, config, (depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), true /* rebind */));
		}
	}
}